

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_impl.h
# Opt level: O2

RcImplApiService * RcImplApiService::get_instance(void)

{
  int iVar1;
  AutoMutex auto_lock;
  Autolock local_18;
  
  if (get_instance()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&get_instance()::instance);
    if (iVar1 != 0) {
      RcImplApiService(&get_instance::instance);
      __cxa_atexit(~RcImplApiService,&get_instance::instance,&__dso_handle);
      __cxa_guard_release(&get_instance()::instance);
    }
  }
  local_18.mLock = get_lock();
  local_18.mEnabled = 1;
  if ((pthread_mutex_t *)local_18.mLock != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)local_18.mLock);
  }
  Mutex::Autolock::~Autolock(&local_18);
  return &get_instance::instance;
}

Assistant:

static RcImplApiService *get_instance() {
        static RcImplApiService instance;
        AutoMutex auto_lock(get_lock());
        return &instance;
    }